

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acec2Mult.c
# Opt level: O3

Vec_Int_t * Sdb_StoFindAll(Vec_Wec_t *vCuts)

{
  Vec_Int_t *pVVar1;
  int iVar2;
  Vec_Int_t *p;
  int *piVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  
  p = (Vec_Int_t *)malloc(0x10);
  p->nCap = 100;
  p->nSize = 0;
  piVar3 = (int *)malloc(400);
  p->pArray = piVar3;
  iVar4 = vCuts->nSize;
  if (0 < iVar4) {
    lVar7 = 0;
    do {
      pVVar1 = vCuts->pArray;
      iVar2 = pVVar1[lVar7].nSize;
      if (0 < iVar2) {
        lVar6 = 0;
        do {
          if (0 < (long)p->nSize) {
            lVar5 = 0;
            do {
              if (p->pArray[lVar5] == pVVar1[lVar7].pArray[lVar6]) goto LAB_0068b474;
              lVar5 = lVar5 + 1;
            } while (p->nSize != lVar5);
          }
          Vec_IntPush(p,pVVar1[lVar7].pArray[lVar6]);
          iVar2 = pVVar1[lVar7].nSize;
LAB_0068b474:
          lVar6 = lVar6 + 1;
        } while (lVar6 < iVar2);
        iVar4 = vCuts->nSize;
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 < iVar4);
  }
  return p;
}

Assistant:

Vec_Int_t * Sdb_StoFindAll( Vec_Wec_t * vCuts )
{
    int i, k, Entry;
    Vec_Int_t * vCut, * vAll = Vec_IntAlloc( 100 );  
    Vec_WecForEachLevel( vCuts, vCut, i )
        Vec_IntForEachEntry( vCut, Entry, k )
            Vec_IntPushUnique( vAll, Entry );
    return vAll;
}